

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O0

err_t stb99DiVal(stb99_seed *seed,size_t r)

{
  bool bVar1;
  size_t i;
  size_t r_local;
  stb99_seed *seed_local;
  
  if (((seed->di[0] < 0x1fffffffffffffff) && (seed->l <= seed->di[0] * 2)) &&
     (seed->di[0] << 3 <= seed->l * 7 - r)) {
    i = 1;
    while( true ) {
      bVar1 = false;
      if (i < 0x12) {
        bVar1 = 0x10 < seed->di[i];
      }
      if (!bVar1) {
        if (0x20 < seed->di[i - 1]) {
          return 0x20c;
        }
        while( true ) {
          if (0x11 < i) {
            return 0;
          }
          if (seed->di[i] != 0) break;
          i = i + 1;
        }
        return 0x20c;
      }
      if (((0x3333333333333332 < seed->di[i]) || (seed->di[i] * 2 < seed->di[i - 1])) ||
         (seed->di[i - 1] * 4 - 0x10 <= seed->di[i] * 5)) break;
      i = i + 1;
    }
  }
  return 0x20c;
}

Assistant:

static err_t stb99DiVal(const stb99_seed* seed, size_t r)
{
	size_t i;
	// проверить di[0]
	ASSERT(7 * seed->l > r);
	if (seed->di[0] >= SIZE_MAX / 8 ||
		seed->l > 2 * seed->di[0] ||
		8 * seed->di[0] > 7 * seed->l - r)
		return ERR_BAD_SEED;
	ASSERT(seed->di[0] > 16);
	// проверить цепочку di
	for (i = 1; i < COUNT_OF(seed->di) && seed->di[i] > 16; ++i)
		if (seed->di[i] >= SIZE_MAX / 5 ||
			seed->di[i - 1] > 2 * seed->di[i] ||
			5 * seed->di[i] >= 4 * seed->di[i - 1] - 16)
			return ERR_BAD_SEED;
	if (seed->di[i - 1] > 32)
		return ERR_BAD_SEED;
	for (; i < COUNT_OF(seed->di); ++i)
		if (seed->di[i] != 0)
			return ERR_BAD_SEED;
	// все хорошо
	return ERR_OK;
}